

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O0

int blake2b_init(blake2b_state *S,size_t outlen)

{
  ulong in_RSI;
  long in_RDI;
  blake2b_param P;
  blake2b_param *P_00;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined6 in_stack_ffffffffffffffba;
  undefined1 auStack_38 [16];
  undefined1 auStack_28 [36];
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -1;
  }
  else if ((in_RSI == 0) || (0x40 < in_RSI)) {
    blake2b_invalidate_state((blake2b_state *)0x11be8d);
    local_4 = -1;
  }
  else {
    P_00 = (blake2b_param *)0x0;
    uVar1 = 0;
    uVar2 = 0;
    memset(&stack0xffffffffffffffba,0,0xe);
    memset(auStack_38,0,0x10);
    memset(auStack_28,0,0x10);
    local_4 = blake2b_init_param((blake2b_state *)
                                 CONCAT62(in_stack_ffffffffffffffba,CONCAT11(uVar2,uVar1)),P_00);
  }
  return local_4;
}

Assistant:

int blake2b_init(blake2b_state *S, size_t outlen) {
	blake2b_param P;

	if (S == NULL) {
		return -1;
	}

	if ((outlen == 0) || (outlen > BLAKE2B_OUTBYTES)) {
		blake2b_invalidate_state(S);
		return -1;
	}

	/* Setup Parameter Block for unkeyed BLAKE2 */
	P.digest_length = (uint8_t)outlen;
	P.key_length = 0;
	P.fanout = 1;
	P.depth = 1;
	P.leaf_length = 0;
	P.node_offset = 0;
	P.node_depth = 0;
	P.inner_length = 0;
	memset(P.reserved, 0, sizeof(P.reserved));
	memset(P.salt, 0, sizeof(P.salt));
	memset(P.personal, 0, sizeof(P.personal));

	return blake2b_init_param(S, &P);
}